

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall
Application::onMessage(Application *this,NewOrderSingle *message,SessionID *sessionID)

{
  char cVar1;
  bool bVar2;
  FieldBase *field;
  IncorrectTagValue *this_00;
  double local_710;
  double local_708;
  double local_700;
  double local_6f8;
  string local_6f0;
  string local_6d0;
  Price price;
  OrderQty orderQty;
  OrdType ordType;
  FieldBase local_5a8;
  Account account;
  ClOrdID clOrdID;
  Side side;
  Symbol symbol;
  FieldBase local_3f0;
  FieldBase local_398;
  FieldBase local_340;
  FieldBase local_2e8;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  ExecutionReport executionReport;
  
  FIX::Symbol::Symbol(&symbol);
  FIX::Side::Side(&side);
  FIX::OrdType::OrdType(&ordType);
  FIX::OrderQty::OrderQty(&orderQty);
  FIX::Price::Price(&price);
  FIX::ClOrdID::ClOrdID(&clOrdID);
  FIX::Account::Account(&account);
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&ordType);
  cVar1 = FIX::CharField::getValue(&ordType.super_CharField);
  if (cVar1 == '2') {
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&symbol);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&side);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&orderQty);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&price);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&clOrdID);
    genOrderID_abi_cxx11_(&local_6d0,this);
    FIX::OrderID::OrderID((OrderID *)&local_5a8,&local_6d0);
    genExecID_abi_cxx11_(&local_6f0,this);
    FIX::ExecID::ExecID((ExecID *)&local_340,&local_6f0);
    FIX::ExecTransType::ExecTransType((ExecTransType *)&local_398,"022F11Application");
    FIX::OrdStatus::OrdStatus((OrdStatus *)&local_3f0,"22F11Application");
    local_6f8 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::LastShares::LastShares((LastShares *)&local_1e0,&local_6f8);
    local_700 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::LastPx::LastPx((LastPx *)&local_238,&local_700);
    local_708 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::CumQty::CumQty((CumQty *)&local_290,&local_708);
    local_710 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::AvgPx::AvgPx((AvgPx *)&local_2e8,&local_710);
    FIX40::ExecutionReport::ExecutionReport
              (&executionReport,(OrderID *)&local_5a8,(ExecID *)&local_340,
               (ExecTransType *)&local_398,(OrdStatus *)&local_3f0,&symbol,&side,
               (OrderQty *)&orderQty.super_QtyField,(LastShares *)&local_1e0,(LastPx *)&local_238,
               (CumQty *)&local_290,(AvgPx *)&local_2e8);
    FIX::FieldBase::~FieldBase(&local_2e8);
    FIX::FieldBase::~FieldBase(&local_290);
    FIX::FieldBase::~FieldBase(&local_238);
    FIX::FieldBase::~FieldBase(&local_1e0);
    FIX::FieldBase::~FieldBase(&local_3f0);
    FIX::FieldBase::~FieldBase(&local_398);
    FIX::FieldBase::~FieldBase(&local_340);
    std::__cxx11::string::~string((string *)&local_6f0);
    FIX::FieldBase::~FieldBase(&local_5a8);
    std::__cxx11::string::~string((string *)&local_6d0);
    FIX40::ExecutionReport::set(&executionReport,&clOrdID);
    bVar2 = FIX::FieldMap::isSetField
                      ((FieldMap *)message,account.super_StringField.super_FieldBase.m_tag);
    if (bVar2) {
      field = FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&account);
      FIX::FieldMap::setField((FieldMap *)&executionReport,field,true);
    }
    FIX::Session::sendToTarget((Message *)&executionReport,sessionID);
    FIX::Message::~Message((Message *)&executionReport);
    FIX::FieldBase::~FieldBase((FieldBase *)&account);
    FIX::FieldBase::~FieldBase((FieldBase *)&clOrdID);
    FIX::FieldBase::~FieldBase((FieldBase *)&price);
    FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
    FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
    FIX::FieldBase::~FieldBase((FieldBase *)&side);
    FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&executionReport,"",(allocator<char> *)&local_5a8);
  FIX::IncorrectTagValue::IncorrectTagValue
            (this_00,ordType.super_CharField.super_FieldBase.m_tag,(string *)&executionReport);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX40::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX40::ExecutionReport executionReport = FIX40::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      symbol,
      side,
      orderQty,
      FIX::LastShares(orderQty),
      FIX::LastPx(price),
      FIX::CumQty(orderQty),
      FIX::AvgPx(price));

  executionReport.set(clOrdID);

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}